

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wang_index_impl.h
# Opt level: O1

double __thiscall
json::WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::jedi
          (WangTreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON> *this
          ,TreeIndexJSON *t1,TreeIndexJSON *t2)

{
  size_type sVar1;
  Matrix<double> *this_00;
  Matrix<double> *this_01;
  Matrix<double> *this_02;
  Matrix<double> *this_03;
  Matrix<double> *this_04;
  Matrix<double> *this_05;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pvVar7;
  int *piVar8;
  bool bVar9;
  pointer pdVar10;
  ulong uVar11;
  double *pdVar12;
  double *pdVar13;
  pointer piVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  ulong extraout_RDX;
  long lVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  uint uVar25;
  size_t sVar26;
  size_t sVar27;
  ulong col;
  ulong uVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double local_188;
  double local_100;
  double local_b8;
  Matrix<double> local_a8;
  ulong local_80;
  long local_78;
  Matrix<double> *local_70;
  double local_68;
  undefined8 uStack_60;
  size_t local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  (this->super_JEDIAlgorithm<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>).
  subproblem_counter_ = 0;
  uVar2 = (t1->super_Constants).tree_size_;
  uVar22 = (t2->super_Constants).tree_size_;
  col = (ulong)uVar22;
  uVar23 = uVar22;
  if (((int)uVar2 < 1) || (uVar23 = uVar2, (int)uVar22 < 1)) {
    return (double)(int)uVar23;
  }
  sVar26 = (size_t)(t1->super_PostLToHeight).postl_to_height_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[(ulong)uVar2 - 1];
  sVar1 = (ulong)uVar2 + 1;
  std::vector<double,_std::allocator<double>_>::resize(&this->del_t1_subtree_,sVar1);
  std::vector<double,_std::allocator<double>_>::resize(&this->del_f1_subtree_,sVar1);
  sVar1 = col + 1;
  std::vector<double,_std::allocator<double>_>::resize(&this->ins_t2_subtree_,sVar1);
  std::vector<double,_std::allocator<double>_>::resize(&this->ins_f2_subtree_,sVar1);
  sVar27 = sVar26 + 1;
  local_50 = sVar26;
  data_structures::Matrix<double>::Matrix(&local_a8,sVar27,sVar1);
  (this->dt_).rows_ = local_a8.rows_;
  (this->dt_).columns_ = local_a8.columns_;
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&(this->dt_).data_,&local_a8.data_);
  if (local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  data_structures::Matrix<double>::Matrix(&local_a8,sVar27,sVar1);
  (this->df_).rows_ = local_a8.rows_;
  (this->df_).columns_ = local_a8.columns_;
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&(this->df_).data_,&local_a8.data_);
  if (local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  data_structures::Matrix<double>::Matrix(&local_a8,sVar27,sVar1);
  (this->e0_).rows_ = local_a8.rows_;
  (this->e0_).columns_ = local_a8.columns_;
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&(this->e0_).data_,&local_a8.data_);
  if (local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  data_structures::Matrix<double>::Matrix(&local_a8,sVar27,sVar1);
  (this->e_).rows_ = local_a8.rows_;
  (this->e_).columns_ = local_a8.columns_;
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&(this->e_).data_,&local_a8.data_);
  if (local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  data_structures::Matrix<double>::Matrix(&local_a8,sVar27,sVar1);
  (this->del_forest_).rows_ = local_a8.rows_;
  (this->del_forest_).columns_ = local_a8.columns_;
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->del_forest_).data_,&local_a8.data_);
  if (local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  data_structures::Matrix<double>::Matrix(&local_a8,sVar27,sVar1);
  (this->del_tree_).rows_ = local_a8.rows_;
  (this->del_tree_).columns_ = local_a8.columns_;
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->del_tree_).data_,&local_a8.data_);
  if (local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  data_structures::Matrix<double>::Matrix(&local_a8,sVar27,sVar1);
  (this->fav_child_dt_).rows_ = local_a8.rows_;
  (this->fav_child_dt_).columns_ = local_a8.columns_;
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&(this->fav_child_dt_).data_);
  if (local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  pdVar5 = (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar10 = (this->dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar10 != pdVar5; pdVar10 = pdVar10 + 1) {
    *pdVar10 = INFINITY;
  }
  pdVar5 = (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar10 = (this->df_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar10 != pdVar5; pdVar10 = pdVar10 + 1) {
    *pdVar10 = INFINITY;
  }
  pdVar10 = (this->e0_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar5 = (this->e0_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar10 != pdVar5) {
    memset(pdVar10,0,((long)pdVar5 + (-8 - (long)pdVar10) & 0xfffffffffffffff8U) + 8);
  }
  pdVar10 = (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar5 = (this->e_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar10 != pdVar5) {
    memset(pdVar10,0,((long)pdVar5 + (-8 - (long)pdVar10) & 0xfffffffffffffff8U) + 8);
  }
  pdVar5 = (this->del_forest_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar10 = (this->del_forest_).data_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start; pdVar10 != pdVar5; pdVar10 = pdVar10 + 1)
  {
    *pdVar10 = INFINITY;
  }
  pdVar5 = (this->del_tree_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar10 = (this->del_tree_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_start; pdVar10 != pdVar5; pdVar10 = pdVar10 + 1) {
    *pdVar10 = INFINITY;
  }
  pdVar5 = (this->fav_child_dt_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar10 = (this->fav_child_dt_).data_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start; pdVar10 != pdVar5; pdVar10 = pdVar10 + 1)
  {
    *pdVar10 = INFINITY;
  }
  pdVar10 = (this->del_t1_subtree_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar5 = (this->del_t1_subtree_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar16 = (long)pdVar5 - (long)pdVar10 >> 3;
  if (pdVar5 == pdVar10) {
    uVar15 = uVar16;
    uVar17 = 0;
  }
  else {
    *pdVar10 = 0.0;
    pdVar5 = (this->del_f1_subtree_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->del_f1_subtree_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar11 = (long)pdVar6 - (long)pdVar5 >> 3;
    if (pdVar6 == pdVar5) {
      uVar15 = uVar11;
      uVar17 = 0;
    }
    else {
      this_00 = &this->dt_;
      this_01 = &this->df_;
      this_02 = &this->e0_;
      this_03 = &this->e_;
      this_04 = &this->del_forest_;
      this_05 = &this->del_tree_;
      local_70 = &this->fav_child_dt_;
      *pdVar5 = 0.0;
      uVar23 = 1;
      if (1 < (int)uVar2) {
        uVar23 = uVar2;
      }
      pvVar7 = (t1->super_PostLToChildren).postl_to_children_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar20 = 1;
      do {
        uVar15 = uVar11;
        uVar17 = uVar20;
        if (uVar20 == uVar11 + (uVar11 == 0)) goto LAB_00104ecf;
        pdVar5[uVar20] = 0.0;
        lVar21 = *(long *)&pvVar7[uVar20 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
        lVar24 = (long)*(pointer *)
                        ((long)&pvVar7[uVar20 - 1].super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl + 8) - lVar21;
        if (lVar24 != 0) {
          uVar25 = 2;
          do {
            lVar19 = (long)*(int *)(lVar21 + (ulong)(uVar25 - 2) * 4);
            uVar17 = lVar19 + 1;
            uVar15 = uVar16;
            if (uVar16 <= uVar17) goto LAB_00104ecf;
            pdVar5[uVar20] = pdVar10[lVar19 + 1] + pdVar5[uVar20];
            uVar17 = (ulong)uVar25;
            uVar25 = uVar25 + 1;
          } while (uVar17 <= (ulong)(lVar24 >> 2));
        }
        uVar15 = uVar16;
        uVar17 = uVar20;
        if (uVar20 == uVar16 + (uVar16 == 0)) goto LAB_00104ecf;
        pdVar10[uVar20] = pdVar5[uVar20] + 1.0;
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar23 + 1);
      pdVar10 = (this->ins_t2_subtree_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      *pdVar10 = 0.0;
      pdVar5 = (this->ins_f2_subtree_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      *pdVar5 = 0.0;
      uVar16 = (long)(this->ins_f2_subtree_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pdVar5 >> 3;
      pvVar7 = (t2->super_PostLToChildren).postl_to_children_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = (long)(this->ins_t2_subtree_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
      uVar23 = 1;
      if (1 < (int)uVar22) {
        uVar23 = uVar22;
      }
      uVar20 = 1;
      while (uVar15 = uVar16, uVar17 = uVar20, uVar20 != uVar16 + (uVar16 == 0)) {
        pdVar5[uVar20] = 0.0;
        lVar21 = *(long *)&pvVar7[uVar20 - 1].super__Vector_base<int,_std::allocator<int>_>._M_impl;
        lVar24 = (long)*(pointer *)
                        ((long)&pvVar7[uVar20 - 1].super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl + 8) - lVar21;
        if (lVar24 != 0) {
          uVar25 = 2;
          do {
            lVar19 = (long)*(int *)(lVar21 + (ulong)(uVar25 - 2) * 4);
            uVar17 = lVar19 + 1;
            uVar15 = uVar11;
            if (uVar11 <= uVar17) goto LAB_00104ecf;
            pdVar5[uVar20] = pdVar10[lVar19 + 1] + pdVar5[uVar20];
            uVar17 = (ulong)uVar25;
            uVar25 = uVar25 + 1;
          } while (uVar17 <= (ulong)(lVar24 >> 2));
        }
        uVar15 = uVar11;
        uVar17 = uVar20;
        if (uVar20 == uVar11 + (uVar11 == 0)) break;
        pdVar10[uVar20] = pdVar5[uVar20] + 1.0;
        uVar20 = uVar20 + 1;
        if (uVar20 == uVar23 + 1) {
          uVar23 = 1;
          if (1 < (int)uVar22) {
            uVar23 = uVar22;
          }
          local_38 = (ulong)(uVar23 + 1);
          uVar22 = 1;
          if (1 < (int)uVar2) {
            uVar22 = uVar2;
          }
          local_48 = (ulong)(uVar22 + 1);
          uVar16 = 1;
          do {
            iVar3 = (t1->super_PostLToFavorableChildOrder).postl_to_favorder_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[uVar16 - 1];
            lVar21 = (long)iVar3;
            local_80 = lVar21 + 1;
            uVar11 = (ulong)(int)local_80;
            local_78 = lVar21 * 3;
            uVar20 = 1;
            local_40 = uVar16;
            do {
              pvVar7 = (t1->super_PostLToChildren).postl_to_children_.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              dVar29 = INFINITY;
              local_b8 = INFINITY;
              if (*(long *)((long)&(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl +
                           local_78 * 8 + 8) !=
                  *(long *)((long)&(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl +
                           local_78 * 8)) {
                pdVar12 = data_structures::Matrix<double>::at
                                    (this_04,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start[lVar21],
                                     uVar20 - 1);
                local_b8 = *pdVar12;
                pdVar12 = data_structures::Matrix<double>::at
                                    (this_05,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start[lVar21],
                                     uVar20 - 1);
                dVar29 = *pdVar12;
              }
              uStack_60 = 0;
              sVar26 = uVar20 - 1;
              pvVar7 = (t2->super_PostLToChildren).postl_to_children_.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              dVar32 = INFINITY;
              dVar30 = INFINITY;
              local_68 = dVar29;
              if (*(pointer *)
                   ((long)&pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
                  != *(pointer *)
                      &pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl) {
                pvVar7 = (t2->super_PostLToChildren).postl_to_children_.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                piVar14 = *(pointer *)
                           &pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl;
                dVar30 = INFINITY;
                dVar32 = INFINITY;
                if (*(pointer *)
                     ((long)&pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl +
                     8) != piVar14) {
                  uVar22 = 1;
                  uVar16 = 0;
                  dVar32 = INFINITY;
                  dVar29 = INFINITY;
                  do {
                    pdVar12 = data_structures::Matrix<double>::at
                                        (this_01,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start
                                                       [lVar21],(long)piVar14[uVar16] + 1);
                    lVar24 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).postl_to_children_
                                                      .
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar26].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar16 * 4);
                    uVar17 = lVar24 + 1;
                    pdVar10 = (this->ins_f2_subtree_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    uVar15 = (long)(this->ins_f2_subtree_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                    if (uVar15 <= uVar17) goto LAB_00104ecf;
                    dVar31 = *pdVar12;
                    dVar30 = pdVar10[lVar24 + 1];
                    pdVar12 = data_structures::Matrix<double>::at
                                        (this_00,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start
                                                       [lVar21],uVar17);
                    lVar24 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).postl_to_children_
                                                      .
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar26].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar16 * 4);
                    uVar17 = lVar24 + 1;
                    pdVar10 = (this->ins_t2_subtree_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    uVar15 = (long)(this->ins_t2_subtree_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                    if (uVar15 <= uVar17) goto LAB_00104ecf;
                    dVar31 = dVar31 - dVar30;
                    dVar30 = *pdVar12 - pdVar10[lVar24 + 1];
                    if (dVar32 <= dVar31) {
                      dVar31 = dVar32;
                    }
                    dVar32 = dVar31;
                    if (dVar29 <= dVar30) {
                      dVar30 = dVar29;
                    }
                    uVar16 = (ulong)uVar22;
                    pvVar7 = (t2->super_PostLToChildren).postl_to_children_.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    piVar14 = *(pointer *)
                               &pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl
                    ;
                    uVar22 = uVar22 + 1;
                    dVar29 = dVar30;
                  } while (uVar16 < (ulong)((long)*(pointer *)
                                                   ((long)&pvVar7[sVar26].
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - (long)piVar14 >> 2));
                }
                pdVar10 = (this->ins_f2_subtree_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                uVar15 = (long)(this->ins_f2_subtree_).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                uVar17 = uVar20;
                if (uVar15 <= uVar20) goto LAB_00104ecf;
                pdVar5 = (this->ins_t2_subtree_).super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar15 = (long)(this->ins_t2_subtree_).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar5 >> 3;
                if (uVar15 <= uVar20) goto LAB_00104ecf;
                dVar32 = dVar32 + pdVar10[uVar20];
                dVar30 = dVar30 + pdVar5[uVar20];
              }
              pvVar7 = (t1->super_PostLToChildren).postl_to_children_.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (*(long *)((long)&(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl +
                           local_78 * 8 + 8) ==
                  *(long *)((long)&(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl +
                           local_78 * 8)) {
                pdVar10 = (this->ins_f2_subtree_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                uVar15 = (long)(this->ins_f2_subtree_).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                uVar17 = uVar20;
                if (uVar15 <= uVar20) goto LAB_00104ecf;
                dVar29 = pdVar10[uVar20];
LAB_00103f79:
                dVar29 = dVar29 + 0.0;
              }
              else {
                pvVar7 = (t2->super_PostLToChildren).postl_to_children_.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                piVar14 = *(pointer *)
                           ((long)&pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl + 8);
                if (piVar14 ==
                    *(pointer *)
                     &pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl) {
                  pdVar10 = (this->del_f1_subtree_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar15 = (long)(this->del_f1_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                  uVar17 = local_80;
                  if (local_80 < uVar15) {
                    dVar29 = pdVar10[lVar21 + 1];
                    goto LAB_00103f79;
                  }
                  goto LAB_00104ecf;
                }
                pdVar12 = data_structures::Matrix<double>::at
                                    (this_03,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start[lVar21],
                                     (long)piVar14[-1] + 1);
                dVar29 = *pdVar12;
              }
              dVar32 = (double)(~-(ulong)(dVar32 <= local_b8) & (ulong)local_b8 |
                               (ulong)dVar32 & -(ulong)(dVar32 <= local_b8));
              uVar16 = -(ulong)(dVar29 <= dVar32);
              pdVar12 = data_structures::Matrix<double>::at
                                  (this_01,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start[lVar21],
                                   uVar20);
              *pdVar12 = (double)(uVar16 & (ulong)dVar29 | ~uVar16 & (ulong)dVar32);
              pdVar12 = data_structures::Matrix<double>::at
                                  (this_01,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start[lVar21],
                                   uVar20);
              dVar29 = *pdVar12;
              dVar32 = cost_model::UnitCostModelJSON<label::JSONLabel>::ren
                                 ((this->
                                  super_JEDIAlgorithm<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
                                  ).c_,(t1->super_PostLToLabelId).postl_to_label_id_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[lVar21],
                                  (t2->super_PostLToLabelId).postl_to_label_id_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar20 - 1]);
              pdVar12 = data_structures::Matrix<double>::at
                                  (this_00,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start[lVar21],
                                   uVar20);
              dVar30 = (double)(~-(ulong)(dVar30 <= local_68) & (ulong)local_68 |
                               (ulong)dVar30 & -(ulong)(dVar30 <= local_68));
              uVar16 = -(ulong)(dVar32 + dVar29 <= dVar30);
              *pdVar12 = (double)(~uVar16 & (ulong)dVar30 | (ulong)(dVar32 + dVar29) & uVar16);
              if ((uint)local_80 != uVar2) {
                iVar4 = (t1->super_PostLToParent).postl_to_parent_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar21];
                piVar14 = (t1->super_PostLToHeight).postl_to_height_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                sVar27 = (size_t)piVar14[iVar4];
                if ((t1->super_PostLToFavChild).postl_to_fav_child_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[iVar4] == iVar3) {
                  pdVar12 = data_structures::Matrix<double>::at
                                      (this_00,(long)piVar14[lVar21],uVar20);
                  dVar29 = *pdVar12;
                  pdVar12 = data_structures::Matrix<double>::at(local_70,sVar27,uVar20);
                  *pdVar12 = dVar29;
                  lVar24 = (long)(t1->super_PostLToParent).postl_to_parent_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar21];
                  uVar17 = lVar24 + 1;
                  pdVar10 = (this->del_f1_subtree_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar15 = (long)(this->del_f1_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                  if (uVar15 <= uVar17) goto LAB_00104ecf;
                  dVar29 = pdVar10[lVar24 + 1];
                  pdVar12 = data_structures::Matrix<double>::at
                                      (this_01,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start
                                                     [lVar21],uVar20);
                  pdVar10 = (this->del_f1_subtree_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar15 = (long)(this->del_f1_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                  uVar17 = uVar11;
                  if (uVar15 <= uVar11) goto LAB_00104ecf;
                  dVar30 = *pdVar12;
                  dVar32 = pdVar10[uVar11];
                  pdVar12 = data_structures::Matrix<double>::at(this_04,sVar27,sVar26);
                  *pdVar12 = (dVar29 + dVar30) - dVar32;
                  lVar24 = (long)(t1->super_PostLToParent).postl_to_parent_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar21];
                  uVar17 = lVar24 + 1;
                  pdVar10 = (this->del_t1_subtree_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar15 = (long)(this->del_t1_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                  if (uVar15 <= uVar17) goto LAB_00104ecf;
                  dVar29 = pdVar10[lVar24 + 1];
                  pdVar12 = data_structures::Matrix<double>::at
                                      (this_00,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start
                                                     [lVar21],uVar20);
                  pdVar10 = (this->del_t1_subtree_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar15 = (long)(this->del_t1_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                  uVar17 = uVar11;
                  if (uVar15 <= uVar11) goto LAB_00104ecf;
                  dVar30 = *pdVar12;
                  dVar32 = pdVar10[uVar11];
                  pdVar12 = data_structures::Matrix<double>::at(this_05,sVar27,sVar26);
                  *pdVar12 = (dVar29 + dVar30) - dVar32;
                  pdVar12 = data_structures::Matrix<double>::at(this_03,sVar27,0);
                  *pdVar12 = 0.0;
                  pvVar7 = (t2->super_PostLToChildren).postl_to_children_.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  piVar14 = *(pointer *)
                             &pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl;
                  if (*(pointer *)
                       ((long)&pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 8) != piVar14) {
                    uVar22 = 1;
                    uVar16 = 0;
                    do {
                      if (uVar22 == 1) {
                        sVar18 = 0;
                      }
                      else {
                        sVar18 = (long)piVar14[uVar22 - 2] + 1;
                      }
                      pdVar12 = data_structures::Matrix<double>::at(this_03,sVar27,sVar18);
                      uVar17 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                        postl_to_children_.
                                                                                                                
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar26].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar16 * 4) + 1;
                      pdVar10 = (this->ins_t2_subtree_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      uVar15 = (long)(this->ins_t2_subtree_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                      if (uVar15 <= uVar17) goto LAB_00104ecf;
                      dVar29 = *pdVar12;
                      dVar30 = pdVar10[uVar17];
                      pdVar12 = data_structures::Matrix<double>::at(this_03,sVar27,uVar17);
                      *pdVar12 = dVar29 + dVar30;
                      uVar16 = (ulong)uVar22;
                      pvVar7 = (t2->super_PostLToChildren).postl_to_children_.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      piVar14 = *(pointer *)
                                 &pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl;
                      uVar22 = uVar22 + 1;
                    } while (uVar16 < (ulong)((long)*(pointer *)
                                                     ((long)&pvVar7[sVar26].
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - (long)piVar14 >> 2));
                  }
                }
                pvVar7 = (t1->super_PostLToChildren).postl_to_children_.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                iVar4 = (t1->super_PostLToParent).postl_to_parent_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar21];
                piVar8 = *(int **)&pvVar7[iVar4].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl;
                if (((*(pointer *)
                       ((long)&pvVar7[iVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl +
                       8) != piVar8) && (*piVar8 == iVar3)) ||
                   ((t1->super_PostLToFavChild).postl_to_fav_child_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[iVar4] != iVar3)) {
                  pdVar12 = data_structures::Matrix<double>::at(this_04,sVar27,sVar26);
                  lVar24 = (long)(t1->super_PostLToParent).postl_to_parent_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar21];
                  uVar17 = lVar24 + 1;
                  pdVar10 = (this->del_f1_subtree_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar15 = (long)(this->del_f1_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                  if (uVar15 <= uVar17) goto LAB_00104ecf;
                  dVar29 = pdVar10[lVar24 + 1];
                  pdVar13 = data_structures::Matrix<double>::at
                                      (this_01,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start
                                                     [lVar21],uVar20);
                  pdVar10 = (this->del_f1_subtree_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar15 = (long)(this->del_f1_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                  uVar17 = uVar11;
                  if (uVar15 <= uVar11) goto LAB_00104ecf;
                  dVar29 = (dVar29 + *pdVar13) - pdVar10[uVar11];
                  if (*pdVar12 <= dVar29) {
                    dVar29 = *pdVar12;
                  }
                  pdVar12 = data_structures::Matrix<double>::at(this_04,sVar27,sVar26);
                  *pdVar12 = dVar29;
                  pdVar12 = data_structures::Matrix<double>::at(this_05,sVar27,sVar26);
                  lVar24 = (long)(t1->super_PostLToParent).postl_to_parent_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar21];
                  uVar17 = lVar24 + 1;
                  pdVar10 = (this->del_t1_subtree_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar15 = (long)(this->del_t1_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                  if (uVar15 <= uVar17) goto LAB_00104ecf;
                  dVar29 = pdVar10[lVar24 + 1];
                  pdVar13 = data_structures::Matrix<double>::at
                                      (this_00,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start
                                                     [lVar21],uVar20);
                  pdVar10 = (this->del_t1_subtree_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar15 = (long)(this->del_t1_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                  uVar17 = uVar11;
                  if (uVar15 <= uVar11) goto LAB_00104ecf;
                  dVar29 = (dVar29 + *pdVar13) - pdVar10[uVar11];
                  if (*pdVar12 <= dVar29) {
                    dVar29 = *pdVar12;
                  }
                  pdVar12 = data_structures::Matrix<double>::at(this_05,sVar27,sVar26);
                  *pdVar12 = dVar29;
                  pdVar12 = data_structures::Matrix<double>::at(this_03,sVar27,0);
                  dVar29 = *pdVar12;
                  pdVar12 = data_structures::Matrix<double>::at(this_02,sVar27,0);
                  *pdVar12 = dVar29;
                  pvVar7 = (t2->super_PostLToChildren).postl_to_children_.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  piVar14 = *(pointer *)
                             &pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl;
                  if (*(pointer *)
                       ((long)&pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 8) != piVar14) {
                    uVar16 = 0;
                    uVar17 = 1;
                    do {
                      pdVar12 = data_structures::Matrix<double>::at
                                          (this_03,sVar27,(long)piVar14[uVar16] + 1);
                      dVar29 = *pdVar12;
                      pdVar12 = data_structures::Matrix<double>::at
                                          (this_02,sVar27,
                                           (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                    postl_to_children_.
                                                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar26].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar16 * 4) + 1);
                      *pdVar12 = dVar29;
                      pvVar7 = (t2->super_PostLToChildren).postl_to_children_.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      piVar14 = *(pointer *)
                                 &pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl;
                      bVar9 = uVar17 < (ulong)((long)*(pointer *)
                                                      ((long)&pvVar7[sVar26].
                                                                                                                            
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - (long)piVar14 >> 2);
                      uVar16 = uVar17;
                      uVar17 = (ulong)((int)uVar17 + 1);
                    } while (bVar9);
                  }
                  pdVar12 = data_structures::Matrix<double>::at(this_02,sVar27,0);
                  pdVar10 = (this->del_t1_subtree_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar15 = (long)(this->del_t1_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                  uVar17 = uVar11;
                  if (uVar15 <= uVar11) goto LAB_00104ecf;
                  dVar29 = *pdVar12;
                  dVar30 = pdVar10[uVar11];
                  pdVar12 = data_structures::Matrix<double>::at(this_03,sVar27,0);
                  *pdVar12 = dVar29 + dVar30;
                  pvVar7 = (t2->super_PostLToChildren).postl_to_children_.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  piVar14 = *(pointer *)
                             &pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl;
                  if (*(pointer *)
                       ((long)&pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 8) != piVar14) {
                    uVar22 = 1;
                    uVar16 = 0;
                    do {
                      if (uVar22 == 1) {
                        pdVar12 = data_structures::Matrix<double>::at(this_03,sVar27,0);
                        lVar24 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                          postl_to_children_.
                                                                                                                    
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar26].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar16 * 4);
                        uVar17 = lVar24 + 1;
                        pdVar10 = (this->ins_t2_subtree_).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        uVar15 = (long)(this->ins_t2_subtree_).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                        if (uVar15 <= uVar17) goto LAB_00104ecf;
                        local_188 = *pdVar12;
                        dVar29 = pdVar10[lVar24 + 1];
                        pdVar12 = data_structures::Matrix<double>::at(this_02,sVar27,uVar17);
                        pdVar10 = (this->del_t1_subtree_).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        uVar15 = (long)(this->del_t1_subtree_).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                        uVar17 = uVar11;
                        if (uVar15 <= uVar11) goto LAB_00104ecf;
                        local_188 = local_188 + dVar29;
                        local_100 = *pdVar12 + pdVar10[uVar11];
                        sVar18 = 0;
                      }
                      else {
                        pdVar12 = data_structures::Matrix<double>::at
                                            (this_03,sVar27,(long)piVar14[uVar22 - 2] + 1);
                        lVar24 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                          postl_to_children_.
                                                                                                                    
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar26].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar16 * 4);
                        uVar17 = lVar24 + 1;
                        pdVar10 = (this->ins_t2_subtree_).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        uVar15 = (long)(this->ins_t2_subtree_).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                        if (uVar15 <= uVar17) goto LAB_00104ecf;
                        local_188 = *pdVar12;
                        dVar29 = pdVar10[lVar24 + 1];
                        pdVar12 = data_structures::Matrix<double>::at(this_02,sVar27,uVar17);
                        pdVar10 = (this->del_t1_subtree_).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        uVar15 = (long)(this->del_t1_subtree_).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                        uVar17 = uVar11;
                        if (uVar15 <= uVar11) goto LAB_00104ecf;
                        local_188 = local_188 + dVar29;
                        local_100 = *pdVar12 + pdVar10[uVar11];
                        sVar18 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                          postl_to_children_.
                                                                                                                    
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar26].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + (ulong)(uVar22 - 2) * 4) + 1;
                      }
                      pdVar12 = data_structures::Matrix<double>::at(this_02,sVar27,sVar18);
                      dVar29 = *pdVar12;
                      pdVar12 = data_structures::Matrix<double>::at
                                          (this_00,(long)(t1->super_PostLToHeight).postl_to_height_.
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[lVar21],
                                           (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                    postl_to_children_.
                                                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar26].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar16 * 4) + 1);
                      dVar30 = dVar29 + *pdVar12;
                      if (local_100 <= dVar29 + *pdVar12) {
                        dVar30 = local_100;
                      }
                      if (local_188 <= dVar30) {
                        dVar30 = local_188;
                      }
                      pdVar12 = data_structures::Matrix<double>::at
                                          (this_03,sVar27,
                                           (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                    postl_to_children_.
                                                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar26].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar16 * 4) + 1);
                      *pdVar12 = dVar30;
                      uVar16 = (ulong)uVar22;
                      pvVar7 = (t2->super_PostLToChildren).postl_to_children_.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      piVar14 = *(pointer *)
                                 &pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl;
                      uVar22 = uVar22 + 1;
                    } while (uVar16 < (ulong)((long)*(pointer *)
                                                     ((long)&pvVar7[sVar26].
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - (long)piVar14 >> 2));
                  }
                  if (uVar20 != col) {
                    pdVar12 = data_structures::Matrix<double>::at(this_02,sVar27,0);
                    dVar29 = *pdVar12;
                    pdVar12 = data_structures::Matrix<double>::at(this_03,sVar27,0);
                    *pdVar12 = dVar29;
                  }
                }
                iVar4 = (t1->super_PostLToParent).postl_to_parent_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar21];
                if ((t1->super_PostLToFavChild).postl_to_left_fav_child_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[iVar4] == iVar3) {
                  lVar24 = (long)(t1->super_PostLToFavChild).postl_to_fav_child_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar4];
                  pdVar12 = data_structures::Matrix<double>::at(this_03,sVar27,0);
                  local_68 = (double)CONCAT44(local_68._4_4_,(int)*pdVar12);
                  pdVar12 = data_structures::Matrix<double>::at(this_03,sVar27,0);
                  dVar29 = *pdVar12;
                  pdVar12 = data_structures::Matrix<double>::at(this_02,sVar27,0);
                  *pdVar12 = dVar29;
                  if (uVar20 != col) {
                    pdVar10 = (this->del_t1_subtree_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    uVar15 = (long)(this->del_t1_subtree_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                    uVar17 = uVar11;
                    if (uVar15 <= uVar11) goto LAB_00104ecf;
                    dVar29 = pdVar10[uVar11];
                    pdVar12 = data_structures::Matrix<double>::at(this_02,sVar27,0);
                    *pdVar12 = dVar29 + *pdVar12;
                  }
                  pvVar7 = (t2->super_PostLToChildren).postl_to_children_.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  piVar14 = *(pointer *)
                             &pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl;
                  if (*(pointer *)
                       ((long)&pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 8) != piVar14) {
                    uVar16 = 0;
                    uVar17 = 1;
                    do {
                      pdVar12 = data_structures::Matrix<double>::at
                                          (this_03,sVar27,(long)piVar14[uVar16] + 1);
                      dVar29 = *pdVar12;
                      pdVar12 = data_structures::Matrix<double>::at
                                          (this_02,sVar27,
                                           (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                    postl_to_children_.
                                                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar26].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar16 * 4) + 1);
                      *pdVar12 = dVar29;
                      pvVar7 = (t2->super_PostLToChildren).postl_to_children_.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      piVar14 = *(pointer *)
                                 &pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl;
                      bVar9 = uVar17 < (ulong)((long)*(pointer *)
                                                      ((long)&pvVar7[sVar26].
                                                                                                                            
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - (long)piVar14 >> 2);
                      uVar16 = uVar17;
                      uVar17 = (ulong)((int)uVar17 + 1);
                    } while (bVar9);
                  }
                  uVar16 = lVar24 + 1;
                  pdVar12 = data_structures::Matrix<double>::at(this_02,sVar27,0);
                  pdVar10 = (this->del_t1_subtree_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar15 = (long)(this->del_t1_subtree_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                  uVar17 = uVar16;
                  if (uVar15 <= uVar16) goto LAB_00104ecf;
                  dVar29 = *pdVar12;
                  dVar30 = pdVar10[lVar24 + 1];
                  pdVar12 = data_structures::Matrix<double>::at(this_03,sVar27,0);
                  *pdVar12 = dVar29 + dVar30;
                  pvVar7 = (t2->super_PostLToChildren).postl_to_children_.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  piVar14 = *(pointer *)
                             &pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl;
                  if (*(pointer *)
                       ((long)&pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl
                       + 8) != piVar14) {
                    uVar22 = 1;
                    uVar28 = 0;
                    do {
                      if (uVar22 == 1) {
                        pdVar12 = data_structures::Matrix<double>::at(this_03,sVar27,0);
                        lVar19 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                          postl_to_children_.
                                                                                                                    
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar26].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar28 * 4);
                        uVar17 = lVar19 + 1;
                        pdVar10 = (this->ins_t2_subtree_).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        uVar15 = (long)(this->ins_t2_subtree_).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                        if (uVar15 <= uVar17) goto LAB_00104ecf;
                        local_188 = *pdVar12;
                        dVar29 = pdVar10[lVar19 + 1];
                        pdVar12 = data_structures::Matrix<double>::at(this_02,sVar27,uVar17);
                        pdVar10 = (this->del_t1_subtree_).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        uVar15 = (long)(this->del_t1_subtree_).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                        uVar17 = uVar16;
                        if (uVar15 <= uVar16) goto LAB_00104ecf;
                        local_188 = local_188 + dVar29;
                        local_100 = *pdVar12 + pdVar10[lVar24 + 1];
                        sVar18 = 0;
                      }
                      else {
                        pdVar12 = data_structures::Matrix<double>::at
                                            (this_03,sVar27,(long)piVar14[uVar22 - 2] + 1);
                        lVar19 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                          postl_to_children_.
                                                                                                                    
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar26].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar28 * 4);
                        uVar17 = lVar19 + 1;
                        pdVar10 = (this->ins_t2_subtree_).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        uVar15 = (long)(this->ins_t2_subtree_).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                        if (uVar15 <= uVar17) goto LAB_00104ecf;
                        local_188 = *pdVar12;
                        dVar29 = pdVar10[lVar19 + 1];
                        pdVar12 = data_structures::Matrix<double>::at(this_02,sVar27,uVar17);
                        pdVar10 = (this->del_t1_subtree_).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        uVar15 = (long)(this->del_t1_subtree_).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar10 >> 3;
                        uVar17 = uVar16;
                        if (uVar15 <= uVar16) goto LAB_00104ecf;
                        local_188 = local_188 + dVar29;
                        local_100 = *pdVar12 + pdVar10[lVar24 + 1];
                        sVar18 = (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                          postl_to_children_.
                                                                                                                    
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar26].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + (ulong)(uVar22 - 2) * 4) + 1;
                      }
                      pdVar12 = data_structures::Matrix<double>::at(this_02,sVar27,sVar18);
                      dVar29 = *pdVar12;
                      pdVar12 = data_structures::Matrix<double>::at
                                          (local_70,sVar27,
                                           (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                    postl_to_children_.
                                                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar26].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar28 * 4) + 1);
                      dVar30 = dVar29 + *pdVar12;
                      if (local_100 <= dVar29 + *pdVar12) {
                        dVar30 = local_100;
                      }
                      if (local_188 <= dVar30) {
                        dVar30 = local_188;
                      }
                      pdVar12 = data_structures::Matrix<double>::at
                                          (this_03,sVar27,
                                           (long)*(int *)(*(long *)&(t2->super_PostLToChildren).
                                                                    postl_to_children_.
                                                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[sVar26].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + uVar28 * 4) + 1);
                      *pdVar12 = dVar30;
                      uVar28 = (ulong)uVar22;
                      pvVar7 = (t2->super_PostLToChildren).postl_to_children_.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      piVar14 = *(pointer *)
                                 &pvVar7[sVar26].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl;
                      uVar22 = uVar22 + 1;
                    } while (uVar28 < (ulong)((long)*(pointer *)
                                                     ((long)&pvVar7[sVar26].
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl + 8) - (long)piVar14 >> 2));
                  }
                  if (uVar20 != col) {
                    dVar29 = (double)local_68._0_4_;
                    pdVar12 = data_structures::Matrix<double>::at(this_03,sVar27,0);
                    *pdVar12 = dVar29;
                  }
                }
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != local_38);
            uVar16 = local_40 + 1;
            if (uVar16 == local_48) {
              pdVar12 = data_structures::Matrix<double>::at(this_00,local_50,col);
              return *pdVar12;
            }
          } while( true );
        }
      }
    }
  }
LAB_00104ecf:
  do {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar17,
               uVar15);
    uVar15 = extraout_RDX;
    uVar17 = local_80;
  } while( true );
}

Assistant:

double WangTreeIndex<CostModel, TreeIndex>::jedi(const TreeIndex& t1, 
    const TreeIndex& t2) {

  // Reset subproblem counter.
  subproblem_counter_ = 0;
  
  int t1_input_size = t1.tree_size_;
  int t2_input_size = t2.tree_size_;
  // Stop if one of the trees is empty.
  if (t1_input_size < 1) {
    return t2_input_size;
  } else if (t2_input_size < 1) {
    return t1_input_size;
  }
  int t1_height = t1.postl_to_height_[t1_input_size-1];

  // Create cost matrices.
  del_t1_subtree_.resize(t1_input_size+1);
  del_f1_subtree_.resize(t1_input_size+1);
  ins_t2_subtree_.resize(t2_input_size+1);
  ins_f2_subtree_.resize(t2_input_size+1);
  dt_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  df_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  e0_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  e_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  del_forest_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  del_tree_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  fav_child_dt_ = data_structures::Matrix<double>(t1_height+1, t2_input_size+1);
  
  // Fill the matrices with inf.
  dt_.fill_with(std::numeric_limits<double>::infinity());
  df_.fill_with(std::numeric_limits<double>::infinity());
  e0_.fill_with(0);
  e_.fill_with(0);
  del_forest_.fill_with(std::numeric_limits<double>::infinity());
  del_tree_.fill_with(std::numeric_limits<double>::infinity());
  fav_child_dt_.fill_with(std::numeric_limits<double>::infinity());

  // Initialize cost matrices.
  del_t1_subtree_.at(0) = 0;
  del_f1_subtree_.at(0) = 0;
  for (int i = 1; i <= t1_input_size; ++i) {
    del_f1_subtree_.at(i) = 0;
    for (unsigned int k = 1; k <= t1.postl_to_children_[i-1].size(); ++k) {
      del_f1_subtree_.at(i) += del_t1_subtree_.at(t1.postl_to_children_[i-1][k-1] + 1);
    }
    del_t1_subtree_.at(i) = del_f1_subtree_.at(i) + c_.del(t1.postl_to_label_id_[i - 1]);
  }

  ins_t2_subtree_[0] = 0;
  ins_f2_subtree_[0] = 0;
  for (int j = 1; j <= t2_input_size; ++j) {
    ins_f2_subtree_.at(j) = 0;
    for (unsigned int k = 1; k <= t2.postl_to_children_[j-1].size(); ++k) {
      ins_f2_subtree_.at(j) += ins_t2_subtree_.at(t2.postl_to_children_[j-1][k-1] + 1);
    }
    ins_t2_subtree_.at(j) = ins_f2_subtree_.at(j) + c_.ins(t2.postl_to_label_id_[j - 1]);
  }
  
  double min_for_ins = std::numeric_limits<double>::infinity();
  double min_tree_ins = std::numeric_limits<double>::infinity();
  double min_for_del = std::numeric_limits<double>::infinity();
  double min_tree_del = std::numeric_limits<double>::infinity();
  double min_for_ren = std::numeric_limits<double>::infinity();
  double min_tree_ren = std::numeric_limits<double>::infinity();
  int i = 0;
  
  for (int x = 1; x <= t1_input_size; ++x) {
    // Get postorder number from favorable child order number.
    i = t1.postl_to_favorder_[x-1] + 1;
    // std::cout << "i: " << i << "\t";
    for (int j = 1; j <= t2_input_size; ++j) {
      // std::cout << "i: " << i << ", j: " << j << std::endl;
      // Cost for deletion.
      if (t1.postl_to_children_[i-1].size() == 0) {
        // t1[i] is a leaf node. Therefore, all nodes of F2 have to be inserted.
        // Must be set to infinity, since we allow infinity costs for different node types.
        min_for_del = std::numeric_limits<double>::infinity(); //ins_f2_subtree_.at(j);
        min_tree_del = std::numeric_limits<double>::infinity(); //ins_t2_subtree_.at(j);
      } else {
        // t1[i] is no leaf node. Therefore, read the previously computed value.
        min_for_del = del_forest_.at(t1.postl_to_height_[i-1], j-1);
        min_tree_del = del_tree_.at(t1.postl_to_height_[i-1], j-1);
      }

      // Cost for insertion.
      if (t2.postl_to_children_[j-1].size() == 0) {
        // t2[j] is a leaf node. Therefore, all nodes of F1 have to be inserted.
        // Must be set to infinity, since we allow infinity costs for different node types.
        min_for_ins = std::numeric_limits<double>::infinity(); //del_f1_subtree_.at(i);
        min_tree_ins = std::numeric_limits<double>::infinity(); //del_t1_subtree_.at(i);
      } else {
        // t2[j] is no leaf node. Therefore, computed the value.
        min_for_ins = std::numeric_limits<double>::infinity();
        min_tree_ins = std::numeric_limits<double>::infinity();
        for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
          min_for_ins = std::min(min_for_ins,
              (df_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t] + 1) - 
               ins_f2_subtree_.at(t2.postl_to_children_[j-1][t] + 1)));
          min_tree_ins = std::min(min_tree_ins,
              (dt_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t] + 1) - 
               ins_t2_subtree_.at(t2.postl_to_children_[j-1][t] + 1)));
        }
        min_for_ins += ins_f2_subtree_.at(j);
        min_tree_ins += ins_t2_subtree_.at(j);
      }

      // Cost for rename.
      min_for_ren = 0;
      if (t1.postl_to_children_[i-1].size() == 0) {
        // t1[i] is a leaf node. Therefore, all nodes of F2 have to be inserted.
        min_for_ren += ins_f2_subtree_.at(j);
      } else if (t2.postl_to_children_[j-1].size() == 0) {
        // t2[j] is a leaf node. Therefore, all nodes of F1 have to be deleted.
        min_for_ren += del_f1_subtree_.at(i);
      } else {
        min_for_ren = e_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t2.postl_to_children_[j-1].size()-1]+1);
      }
      // Fill forest distance matrix.
      df_.at(t1.postl_to_height_[i-1], j) = min_for_del >= min_for_ins ? min_for_ins >= min_for_ren ? min_for_ren : min_for_ins : min_for_del >= min_for_ren ? min_for_ren : min_for_del;
      // Compute tree rename based on forest cost matrix.
      min_tree_ren = df_.at(t1.postl_to_height_[i-1], j) + c_.ren(t1.postl_to_label_id_[i-1], t2.postl_to_label_id_[j-1]);

      // Fill tree distance matrix.
      dt_.at(t1.postl_to_height_[i-1], j) = min_tree_del >= min_tree_ins ? min_tree_ins >= min_tree_ren ? min_tree_ren : min_tree_ins : min_tree_del >= min_tree_ren ? min_tree_ren : min_tree_del;

      // Do not compute for the parent of the root node in T1.
      if (i != t1_input_size)
      {
        int p_i = t1.postl_to_height_[t1.postl_to_parent_[i-1]];
        // Case 1: i is favorable child of parent.
        if (t1.postl_to_fav_child_[t1.postl_to_parent_[i-1]] == i-1) {
          fav_child_dt_.at(p_i, j) = dt_.at(t1.postl_to_height_[i-1], j);
          del_forest_.at(p_i, j-1) = del_f1_subtree_.at(t1.postl_to_parent_[i-1]+1) + df_.at(t1.postl_to_height_[i-1], j) - del_f1_subtree_.at(i);
          del_tree_.at  (p_i, j-1) = del_t1_subtree_.at(t1.postl_to_parent_[i-1]+1) + dt_.at(t1.postl_to_height_[i-1], j) - del_t1_subtree_.at(i);
          e_.at(p_i, 0) = 0;
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            if (t == 0) {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = e_.at(p_i, 0) + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1);
            } else {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = e_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1);
            }
          }
        }
        // Case 2: i is either leftmost child (and favorable) OR not favorable child.
        if ((t1.postl_to_children_[t1.postl_to_parent_[i-1]].size() > 0 && 
            t1.postl_to_children_[t1.postl_to_parent_[i-1]][0] == i-1) ||
            t1.postl_to_fav_child_[t1.postl_to_parent_[i-1]] != i-1) {
          del_forest_.at(p_i, j-1) = std::min(del_forest_.at(p_i, j-1), del_f1_subtree_.at(t1.postl_to_parent_[i-1]+1) + df_.at(t1.postl_to_height_[i-1], j) - del_f1_subtree_.at(i));
          del_tree_.at(p_i, j-1) = std::min(del_tree_.at(p_i, j-1), del_t1_subtree_.at(t1.postl_to_parent_[i-1]+1) + dt_.at(t1.postl_to_height_[i-1], j) - del_t1_subtree_.at(i));
          // Copy e into e0.
          e0_.at(p_i, 0) = e_.at(p_i, 0);
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            e0_.at(p_i, t2.postl_to_children_[j-1][t] + 1) = e_.at(p_i, t2.postl_to_children_[j-1][t] + 1);
          }
          // Fill next line.
          e_.at(p_i, 0) = e0_.at(p_i, 0) + del_t1_subtree_.at(i);
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            if (t == 0) {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = std::min(
                 e_.at(p_i, 0)                                 + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1), std::min(
                e0_.at(p_i, t2.postl_to_children_[j-1][t]  +1) + del_t1_subtree_.at(i),
                e0_.at(p_i, 0)                                 + dt_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t]+1))
              );
            } else {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = std::min(
                 e_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1), std::min(
                e0_.at(p_i, t2.postl_to_children_[j-1][t]  +1) + del_t1_subtree_.at(i),
                e0_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + dt_.at(t1.postl_to_height_[i-1], t2.postl_to_children_[j-1][t]+1))
              );
            }
          }
          if (j != t2_input_size) {
            e_.at(p_i, 0) = e0_.at(p_i, 0);
          }
        }
        // Case 3: t[i] is the left sibling of the favorable child.
        if (t1.postl_to_left_fav_child_[t1.postl_to_parent_[i-1]] == i-1) {
          int fav_child_postid = t1.postl_to_fav_child_[t1.postl_to_parent_[i-1]]+1;
          // Store initial value of first column in edit distance cost matrix.
          // It is needed for the next j. Therefore rewrite at the end.
          int old_val = e_.at(p_i, 0);
          // Copy e into e0.
          e0_.at(p_i, 0) = e_.at(p_i, 0);
          if (j != t2_input_size) {
            e0_.at(p_i, 0) += del_t1_subtree_.at(i);
          }
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            e0_.at(p_i, t2.postl_to_children_[j-1][t] + 1) = e_.at(p_i, t2.postl_to_children_[j-1][t] + 1);
          }
          // Fill next line.
          e_.at(p_i, 0) = e0_.at(p_i, 0) + del_t1_subtree_.at(fav_child_postid);
          for (unsigned int t = 0; t < t2.postl_to_children_[j-1].size(); ++t) {
            if (t == 0) {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = std::min(
                 e_.at(p_i, 0)                                 + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1), std::min(
                e0_.at(p_i, t2.postl_to_children_[j-1][t]  +1) + del_t1_subtree_.at(fav_child_postid),
                e0_.at(p_i, 0)                                 + fav_child_dt_.at(p_i, t2.postl_to_children_[j-1][t]+1))
              );
            } else {
              e_.at(p_i, t2.postl_to_children_[j-1][t]+1) = std::min(
                 e_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + ins_t2_subtree_.at(t2.postl_to_children_[j-1][t]+1), std::min(
                e0_.at(p_i, t2.postl_to_children_[j-1][t]  +1) + del_t1_subtree_.at(fav_child_postid),
                e0_.at(p_i, t2.postl_to_children_[j-1][t-1]+1) + fav_child_dt_.at(p_i, t2.postl_to_children_[j-1][t]+1))
              );
            }
          }
          if (j != t2_input_size) {
            e_.at(p_i, 0) = old_val;
          }
        }
      }
    }
  }

  return dt_.at(t1_height, t2_input_size);
}